

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVector3.cpp
# Opt level: O0

void __thiscall
utVector3_CreationTest_Test::~utVector3_CreationTest_Test(utVector3_CreationTest_Test *this)

{
  utVector3_CreationTest_Test *this_local;
  
  ~utVector3_CreationTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(utVector3, CreationTest) {
    aiVector3D v0;
    aiVector3D v1( 1.0f, 2.0f, 3.0f );
    EXPECT_FLOAT_EQ (1.0f, v1[ 0 ] );
    EXPECT_FLOAT_EQ( 2.0f, v1[ 1 ] );
    EXPECT_FLOAT_EQ( 3.0f, v1[ 2 ] );
    aiVector3D v2( 1 );
    EXPECT_FLOAT_EQ( 1.0f, v2[ 0 ] );
    EXPECT_FLOAT_EQ( 1.0f, v2[ 1 ] );
    EXPECT_FLOAT_EQ( 1.0f, v2[ 2 ] );
    aiVector3D v3( v1 );
    EXPECT_FLOAT_EQ( v1[ 0 ], v3[ 0 ] );
    EXPECT_FLOAT_EQ( v1[ 1 ], v3[ 1 ] );
    EXPECT_FLOAT_EQ( v1[ 2 ], v3[ 2 ] );
}